

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

int __thiscall
ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,double *determinant,double *pivot)

{
  double dVar1;
  double **ppdVar2;
  int local_6c;
  int n;
  double **this_m;
  int rank;
  int ix;
  int k;
  int i;
  double det;
  double piv;
  double x;
  double *pivot_local;
  double *determinant_local;
  double zero_tolerance_local;
  ON_Matrix *this_local;
  
  ppdVar2 = ThisM(this);
  _k = 1.0;
  det = 1.0;
  this_m._0_4_ = 0;
  if (this->m_col_count < this->m_row_count) {
    local_6c = this->m_col_count;
  }
  else {
    local_6c = this->m_row_count;
  }
  rank = 0;
  do {
    if (local_6c <= rank) {
LAB_006f6f6f:
      *pivot = det;
      *determinant = _k;
      return (int)this_m;
    }
    this_m._4_4_ = rank;
    piv = ABS(ppdVar2[rank][rank]);
    ix = rank;
    while (ix = ix + 1, ix < this->m_row_count) {
      if (piv < ABS(ppdVar2[ix][rank])) {
        this_m._4_4_ = ix;
        piv = ABS(ppdVar2[ix][rank]);
      }
    }
    if ((piv < det) || (rank == 0)) {
      det = piv;
    }
    if (piv <= zero_tolerance) {
      _k = 0.0;
      goto LAB_006f6f6f;
    }
    this_m._0_4_ = (int)this_m + 1;
    if (this_m._4_4_ != rank) {
      SwapRows(this,this_m._4_4_,rank);
      _k = -_k;
    }
    _k = ppdVar2[rank][rank] * _k;
    dVar1 = ppdVar2[rank][rank];
    ppdVar2[rank][rank] = 1.0;
    ON_ArrayScale((this->m_col_count + -1) - rank,1.0 / dVar1,ppdVar2[rank] + (rank + 1),
                  ppdVar2[rank] + (rank + 1));
    ix = rank;
    while (ix = ix + 1, ix < this->m_row_count) {
      dVar1 = ppdVar2[ix][rank];
      ppdVar2[ix][rank] = 0.0;
      if (zero_tolerance < ABS(-dVar1)) {
        ON_Array_aA_plus_B((this->m_col_count + -1) - rank,-dVar1,ppdVar2[rank] + (rank + 1),
                           ppdVar2[ix] + (rank + 1),ppdVar2[ix] + (rank + 1));
      }
    }
    rank = rank + 1;
  } while( true );
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    double& determinant,
    double& pivot 
    )
{
  double x, piv, det;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = det = 1.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance ) {
      det = 0.0;
      break;
    }
    rank++;

    if ( ix != k )
    {
      // swap rows
      SwapRows( ix, k );
      det = -det;
    }

    // scale row k of matrix and B
    det *= this_m[k][k];
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
      }
    }
  }

  pivot = piv;
  determinant = det;

  return rank;
}